

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_generator.h
# Opt level: O0

void __thiscall google::protobuf::compiler::csharp::Generator::Generator(Generator *this)

{
  Generator *this_local;
  
  CodeGenerator::CodeGenerator(&this->super_CodeGenerator);
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__Generator_006f5a00;
  return;
}

Assistant:

class LIBPROTOC_EXPORT Generator
    : public google::protobuf::compiler::CodeGenerator {
public:
  virtual bool Generate(
      const FileDescriptor* file,
      const string& parameter,
      GeneratorContext* generator_context,
      string* error) const;
}